

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderSharedVarTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::SharedBasicVarCase::iterate(SharedBasicVarCase *this)

{
  GLuint program;
  DataType DVar1;
  Precision PVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  int iVar5;
  GLuint index;
  GLint GVar6;
  GLint GVar7;
  GLint GVar8;
  int iVar9;
  GLenum GVar10;
  deBool dVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ObjectTraits *traits;
  long lVar12;
  glUniform1fvFunc *pp_Var13;
  glUniform1uivFunc *pp_Var14;
  void *pvVar15;
  glUniform1ivFunc *pp_Var16;
  glUniformMatrix2fvFunc *pp_Var17;
  TestError *this_00;
  ulong uVar18;
  char *description;
  bool bVar19;
  int iVar20;
  uint uVar21;
  int iVar22;
  uint uVar23;
  int location;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  Random rnd;
  Buffer outputBuffer;
  vector<float,_std::allocator<float>_> values;
  InterfaceBlockInfo outBlockInfo;
  allocator_type local_299;
  Functions *local_298;
  glUniformMatrix4fvFunc *local_290;
  glUniformMatrix4fvFunc *local_288;
  glUniformMatrix4fvFunc *local_280;
  glUniformMatrix4fvFunc *local_278;
  glUniformMatrix4fvFunc *local_270;
  glUniformMatrix4fvFunc *local_268;
  undefined1 local_260 [80];
  ObjectWrapper local_210;
  undefined1 local_1f8 [8];
  TestLog *local_1f0;
  pointer local_1e8;
  ios_base local_180 [264];
  undefined1 local_78 [64];
  pointer local_38;
  Functions *gl;
  
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar5);
  program = (this->m_program->m_program).m_program;
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  traits = glu::objectTraits(OBJECTTYPE_BUFFER);
  glu::ObjectWrapper::ObjectWrapper(&local_210,(Functions *)CONCAT44(extraout_var_00,iVar5),traits);
  index = (*gl->getProgramResourceIndex)(program,0x92e6,"Result");
  local_78._0_8_ = local_78 + 0x10;
  local_78._8_8_ = 0;
  local_78[0x10] = '\0';
  local_78._32_4_ = 0xffffffff;
  local_78._36_4_ = 0;
  local_78._40_4_ = 0;
  local_78._48_16_ = (undefined1  [16])0x0;
  local_38 = (pointer)0x0;
  glu::getProgramInterfaceBlockInfo(gl,program,0x92e6,index,(InterfaceBlockInfo *)local_78);
  (*gl->useProgram)(program);
  iVar5 = (this->m_workGroupSize).m_data[1] * (this->m_workGroupSize).m_data[0] *
          (this->m_workGroupSize).m_data[2];
  GVar6 = (*gl->getUniformLocation)(program,"u_val[0]");
  GVar7 = (*gl->getUniformLocation)(program,"u_ref[0]");
  GVar8 = (*gl->getUniformLocation)(program,"u_numIters");
  iVar9 = glu::getDataTypeScalarSize(this->m_basicType);
  DVar1 = this->m_basicType;
  local_298 = gl;
  if (DVar1 - TYPE_FLOAT < 4) {
    iVar22 = 0x400;
    if (this->m_precision == PRECISION_LOWP) {
      iVar22 = 2;
    }
    iVar20 = iVar5 / 2;
    if (iVar22 <= iVar5 / 2) {
      iVar20 = iVar22;
    }
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)local_1f8,(long)(iVar9 * iVar5),
               (allocator_type *)local_260);
    auVar3 = _DAT_019ec5b0;
    uVar21 = (uint)((ulong)((long)local_1f0 - (long)local_1f8) >> 2);
    if (0 < (int)uVar21) {
      iVar22 = iVar20 + iVar22 + 1;
      lVar12 = (ulong)(uVar21 & 0x7fffffff) - 1;
      auVar24._8_4_ = (int)lVar12;
      auVar24._0_8_ = lVar12;
      auVar24._12_4_ = (int)((ulong)lVar12 >> 0x20);
      uVar18 = 0;
      auVar24 = auVar24 ^ _DAT_019ec5b0;
      auVar28 = _DAT_019f34d0;
      do {
        auVar30 = auVar28 ^ auVar3;
        if ((bool)(~(auVar30._4_4_ == auVar24._4_4_ && auVar24._0_4_ < auVar30._0_4_ ||
                    auVar24._4_4_ < auVar30._4_4_) & 1)) {
          *(float *)((long)(qpTestLog **)local_1f8 + uVar18 * 4) =
               (float)((int)((long)((ulong)(uint)((int)uVar18 >> 0x1f) << 0x20 | uVar18 & 0xffffffff
                                   ) % (long)iVar22) - iVar20);
        }
        if ((auVar30._12_4_ != auVar24._12_4_ || auVar30._8_4_ <= auVar24._8_4_) &&
            auVar30._12_4_ <= auVar24._12_4_) {
          *(float *)((long)(qpTestLog **)local_1f8 + uVar18 * 4 + 4) =
               (float)(((int)uVar18 + 1) % iVar22 - iVar20);
        }
        uVar18 = uVar18 + 2;
        lVar12 = auVar28._8_8_;
        auVar28._0_8_ = auVar28._0_8_ + 2;
        auVar28._8_8_ = lVar12 + 2;
      } while ((uVar21 + 1 & 0xfffffffe) != uVar18);
    }
    bVar4 = true;
    do {
      bVar19 = bVar4;
      pp_Var13 = &gl->uniform1fv;
      switch(iVar9) {
      case 1:
        break;
      case 2:
        pp_Var13 = &gl->uniform2fv;
        break;
      case 3:
        pp_Var13 = &gl->uniform3fv;
        break;
      case 4:
        pp_Var13 = &gl->uniform4fv;
        break;
      default:
        goto switchD_013e6665_default;
      }
      (**pp_Var13)(GVar6,iVar5,(GLfloat *)local_1f8);
switchD_013e6665_default:
      GVar6 = GVar7;
      bVar4 = false;
    } while (bVar19);
  }
  else if (DVar1 - TYPE_INT < 4) {
    iVar22 = 0x400;
    if (this->m_precision == PRECISION_LOWP) {
      iVar22 = 0x40;
    }
    iVar20 = iVar5 / 2;
    if (iVar22 <= iVar5 / 2) {
      iVar20 = iVar22;
    }
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_1f8,(long)(iVar9 * iVar5),
               (allocator_type *)local_260);
    auVar3 = _DAT_019ec5b0;
    uVar21 = (uint)((ulong)((long)local_1f0 - (long)local_1f8) >> 2);
    if (0 < (int)uVar21) {
      iVar22 = iVar20 + iVar22 + 1;
      lVar12 = (ulong)(uVar21 & 0x7fffffff) - 1;
      auVar25._8_4_ = (int)lVar12;
      auVar25._0_8_ = lVar12;
      auVar25._12_4_ = (int)((ulong)lVar12 >> 0x20);
      uVar18 = 0;
      auVar25 = auVar25 ^ _DAT_019ec5b0;
      auVar30 = _DAT_019f34d0;
      do {
        auVar31 = auVar30 ^ auVar3;
        if ((bool)(~(auVar31._4_4_ == auVar25._4_4_ && auVar25._0_4_ < auVar31._0_4_ ||
                    auVar25._4_4_ < auVar31._4_4_) & 1)) {
          *(int *)((long)(qpTestLog **)local_1f8 + uVar18 * 4) =
               (int)((long)((ulong)(uint)((int)uVar18 >> 0x1f) << 0x20 | uVar18 & 0xffffffff) %
                    (long)iVar22) - iVar20;
        }
        if ((auVar31._12_4_ != auVar25._12_4_ || auVar31._8_4_ <= auVar25._8_4_) &&
            auVar31._12_4_ <= auVar25._12_4_) {
          *(int *)((long)(qpTestLog **)local_1f8 + uVar18 * 4 + 4) =
               ((int)uVar18 + 1) % iVar22 - iVar20;
        }
        uVar18 = uVar18 + 2;
        lVar12 = auVar30._8_8_;
        auVar30._0_8_ = auVar30._0_8_ + 2;
        auVar30._8_8_ = lVar12 + 2;
      } while ((uVar21 + 1 & 0xfffffffe) != uVar18);
    }
    bVar4 = true;
    do {
      bVar19 = bVar4;
      pp_Var16 = &gl->uniform1iv;
      switch(iVar9) {
      case 1:
        break;
      case 2:
        pp_Var16 = &gl->uniform2iv;
        break;
      case 3:
        pp_Var16 = &gl->uniform3iv;
        break;
      case 4:
        pp_Var16 = &gl->uniform4iv;
        break;
      default:
        goto switchD_013e67f3_default;
      }
      (**pp_Var16)(GVar6,iVar5,(GLint *)local_1f8);
switchD_013e67f3_default:
      GVar6 = GVar7;
      bVar4 = false;
    } while (bVar19);
  }
  else {
    if (3 < DVar1 - TYPE_UINT) {
      if (DVar1 - TYPE_BOOL < 4) {
        deRandom_init((deRandom *)local_260,0x324f);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)local_1f8,(long)(iVar9 * iVar5),&local_299);
        if (0 < (int)((ulong)((long)local_1f0 - (long)local_1f8) >> 2)) {
          lVar12 = 0;
          do {
            dVar11 = deRandom_getBool((deRandom *)local_260);
            *(uint *)((long)(qpTestLog **)local_1f8 + lVar12 * 4) = (uint)(dVar11 == 1);
            lVar12 = lVar12 + 1;
          } while (lVar12 < (int)((ulong)((long)local_1f0 - (long)local_1f8) >> 2));
        }
        bVar4 = true;
        do {
          bVar19 = bVar4;
          pp_Var16 = &gl->uniform1iv;
          switch(iVar9) {
          case 1:
            break;
          case 2:
            pp_Var16 = &gl->uniform2iv;
            break;
          case 3:
            pp_Var16 = &gl->uniform3iv;
            break;
          case 4:
            pp_Var16 = &gl->uniform4iv;
            break;
          default:
            goto switchD_013e6f57_default;
          }
          (**pp_Var16)(GVar6,iVar5,(GLint *)local_1f8);
switchD_013e6f57_default:
          GVar6 = GVar7;
          bVar4 = false;
        } while (bVar19);
        gl = local_298;
        if (local_1f8 != (undefined1  [8])0x0) {
          operator_delete((void *)local_1f8,(long)local_1e8 - (long)local_1f8);
          gl = local_298;
        }
      }
      else if (DVar1 - TYPE_FLOAT_MAT2 < 9 || DVar1 - TYPE_DOUBLE_MAT2 < 9) {
        iVar22 = 0x400;
        if (this->m_precision == PRECISION_LOWP) {
          iVar22 = 2;
        }
        iVar20 = iVar5 / 2;
        if (iVar22 <= iVar5 / 2) {
          iVar20 = iVar22;
        }
        std::vector<float,_std::allocator<float>_>::vector
                  ((vector<float,_std::allocator<float>_> *)local_1f8,(long)(iVar9 * iVar5),
                   (allocator_type *)local_260);
        auVar3 = _DAT_019ec5b0;
        uVar21 = (uint)((ulong)((long)local_1f0 - (long)local_1f8) >> 2);
        if (0 < (int)uVar21) {
          iVar9 = iVar20 + iVar22 + 1;
          lVar12 = (ulong)(uVar21 & 0x7fffffff) - 1;
          auVar27._8_4_ = (int)lVar12;
          auVar27._0_8_ = lVar12;
          auVar27._12_4_ = (int)((ulong)lVar12 >> 0x20);
          uVar18 = 0;
          auVar27 = auVar27 ^ _DAT_019ec5b0;
          auVar29 = _DAT_019f34d0;
          do {
            auVar30 = auVar29 ^ auVar3;
            if ((bool)(~(auVar30._4_4_ == auVar27._4_4_ && auVar27._0_4_ < auVar30._0_4_ ||
                        auVar27._4_4_ < auVar30._4_4_) & 1)) {
              *(float *)((long)(qpTestLog **)local_1f8 + uVar18 * 4) =
                   (float)((int)((long)((ulong)(uint)((int)uVar18 >> 0x1f) << 0x20 |
                                       uVar18 & 0xffffffff) % (long)iVar9) - iVar20);
            }
            if ((auVar30._12_4_ != auVar27._12_4_ || auVar30._8_4_ <= auVar27._8_4_) &&
                auVar30._12_4_ <= auVar27._12_4_) {
              *(float *)((long)(qpTestLog **)local_1f8 + uVar18 * 4 + 4) =
                   (float)(((int)uVar18 + 1) % iVar9 - iVar20);
            }
            uVar18 = uVar18 + 2;
            lVar12 = auVar29._8_8_;
            auVar29._0_8_ = auVar29._0_8_ + 2;
            auVar29._8_8_ = lVar12 + 2;
          } while ((uVar21 + 1 & 0xfffffffe) != uVar18);
        }
        local_268 = &gl->uniformMatrix4x2fv;
        local_270 = &gl->uniformMatrix3x4fv;
        local_278 = &gl->uniformMatrix3fv;
        local_280 = &gl->uniformMatrix3x2fv;
        local_288 = &gl->uniformMatrix2x4fv;
        local_290 = &gl->uniformMatrix2x3fv;
        bVar4 = true;
        do {
          bVar19 = bVar4;
          pp_Var17 = &gl->uniformMatrix2fv;
          switch(this->m_basicType) {
          case TYPE_FLOAT_MAT2:
            break;
          case TYPE_FLOAT_MAT2X3:
            pp_Var17 = local_290;
            break;
          case TYPE_FLOAT_MAT2X4:
            pp_Var17 = local_288;
            break;
          case TYPE_FLOAT_MAT3X2:
            pp_Var17 = local_280;
            break;
          case TYPE_FLOAT_MAT3:
            pp_Var17 = local_278;
            break;
          case TYPE_FLOAT_MAT3X4:
            pp_Var17 = local_270;
            break;
          case TYPE_FLOAT_MAT4X2:
            pp_Var17 = local_268;
            break;
          case TYPE_FLOAT_MAT4X3:
            pp_Var17 = &gl->uniformMatrix4x3fv;
            break;
          case TYPE_FLOAT_MAT4:
            pp_Var17 = &gl->uniformMatrix4fv;
            break;
          default:
            goto switchD_013e7172_default;
          }
          (**pp_Var17)(GVar6,iVar5,'\0',(GLfloat *)local_1f8);
switchD_013e7172_default:
          GVar6 = GVar7;
          bVar4 = false;
        } while (bVar19);
        if (local_1f8 != (undefined1  [8])0x0) {
          operator_delete((void *)local_1f8,(long)local_1e8 - (long)local_1f8);
        }
      }
      goto LAB_013e69ca;
    }
    PVar2 = this->m_precision;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1f8,
               (long)(iVar9 * iVar5),(allocator_type *)local_260);
    auVar3 = _DAT_019ec5b0;
    uVar21 = (uint)((ulong)((long)local_1f0 - (long)local_1f8) >> 2);
    if (0 < (int)uVar21) {
      uVar23 = 0x401;
      if (PVar2 == PRECISION_LOWP) {
        uVar23 = 0x81;
      }
      lVar12 = (ulong)(uVar21 & 0x7fffffff) - 1;
      auVar26._8_4_ = (int)lVar12;
      auVar26._0_8_ = lVar12;
      auVar26._12_4_ = (int)((ulong)lVar12 >> 0x20);
      uVar18 = 0;
      auVar26 = auVar26 ^ _DAT_019ec5b0;
      auVar31 = _DAT_019f34d0;
      do {
        auVar30 = auVar31 ^ auVar3;
        if ((bool)(~(auVar30._4_4_ == auVar26._4_4_ && auVar26._0_4_ < auVar30._0_4_ ||
                    auVar26._4_4_ < auVar30._4_4_) & 1)) {
          *(int *)((long)(qpTestLog **)local_1f8 + uVar18 * 4) =
               (int)((uVar18 & 0xffffffff) % (ulong)uVar23);
        }
        if ((auVar30._12_4_ != auVar26._12_4_ || auVar30._8_4_ <= auVar26._8_4_) &&
            auVar30._12_4_ <= auVar26._12_4_) {
          *(uint *)((long)(qpTestLog **)local_1f8 + uVar18 * 4 + 4) = ((int)uVar18 + 1U) % uVar23;
        }
        uVar18 = uVar18 + 2;
        lVar12 = auVar31._8_8_;
        auVar31._0_8_ = auVar31._0_8_ + 2;
        auVar31._8_8_ = lVar12 + 2;
      } while ((uVar21 + 1 & 0xfffffffe) != uVar18);
    }
    bVar4 = true;
    do {
      bVar19 = bVar4;
      pp_Var14 = &gl->uniform1uiv;
      switch(iVar9) {
      case 1:
        break;
      case 2:
        pp_Var14 = &gl->uniform2uiv;
        break;
      case 3:
        pp_Var14 = &gl->uniform3uiv;
        break;
      case 4:
        pp_Var14 = &gl->uniform4uiv;
        break;
      default:
        goto switchD_013e6967_default;
      }
      (**pp_Var14)(GVar6,iVar5,(GLuint *)local_1f8);
switchD_013e6967_default:
      GVar6 = GVar7;
      bVar4 = false;
    } while (bVar19);
  }
  gl = local_298;
  if (local_1f8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_1f8,(long)local_1e8 - (long)local_1f8);
    gl = local_298;
  }
LAB_013e69ca:
  (*gl->uniform1ui)(GVar8,(this->m_workGroupSize).m_data[1] * (this->m_workGroupSize).m_data[0] *
                          (this->m_workGroupSize).m_data[2]);
  GVar10 = (*gl->getError)();
  glu::checkError(GVar10,"Input value setup failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderSharedVarTests.cpp"
                  ,0x12a);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1f8,
             (ulong)(uint)local_78._40_4_,(allocator_type *)local_260);
  if (local_1f8 != (undefined1  [8])local_1f0) {
    memset((void *)local_1f8,0,(long)local_1f0 - (long)local_1f8);
  }
  (*gl->bindBuffer)(0x90d2,local_210.m_object);
  (*gl->bufferData)(0x90d2,(ulong)(uint)local_78._40_4_,(void *)local_1f8,0x88e5);
  (*gl->bindBufferBase)(0x90d2,0,local_210.m_object);
  GVar10 = (*gl->getError)();
  glu::checkError(GVar10,"Output buffer setup failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderSharedVarTests.cpp"
                  ,0x135);
  if (local_1f8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_1f8,(long)local_1e8 - (long)local_1f8);
  }
  (*gl->dispatchCompute)(1,1,1);
  uVar21 = (this->m_workGroupSize).m_data[1] * (this->m_workGroupSize).m_data[0] *
           (this->m_workGroupSize).m_data[2];
  local_260._0_8_ = local_260 + 0x10;
  local_260._8_8_ = 0;
  local_260[0x10] = '\0';
  local_260._32_4_ = 0xffffffff;
  local_260._36_4_ = 0xffffffff;
  local_260._40_4_ = 0xffffffff;
  local_260._44_4_ = 0;
  local_260._48_4_ = 0;
  local_260._52_4_ = 0;
  local_260._56_4_ = 0;
  local_260._60_13_ = SUB1613((undefined1  [16])0x0,3);
  glu::getProgramInterfaceVariableInfo
            (gl,program,0x92e5,*(deUint32 *)local_78._48_8_,(InterfaceVariableInfo *)local_260);
  pvVar15 = (*gl->mapBufferRange)(0x90d2,0,(ulong)(uint)local_78._40_4_,1);
  GVar10 = (*gl->getError)();
  glu::checkError(GVar10,"glMapBufferRange()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderSharedVarTests.cpp"
                  ,0x142);
  if (pvVar15 == (void *)0x0) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,(char *)0x0,"resPtr",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderSharedVarTests.cpp"
               ,0x143);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  if (uVar21 == 0) {
    iVar5 = 0;
  }
  else {
    uVar18 = 0;
    iVar5 = 0;
    do {
      if (*(int *)((long)pvVar15 +
                  (ulong)(uint)(local_260._56_4_ * (int)uVar18) + (ulong)(uint)local_260._52_4_) ==
          0) {
        if (iVar5 < 10) {
          local_1f8 = (undefined1  [8])
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,"ERROR: isOk[",0xc);
          std::ostream::_M_insert<unsigned_long>((ulong)&local_1f0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"] = ",4);
          std::ostream::operator<<((ostringstream *)&local_1f0,0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0," != true",8);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f0);
          std::ios_base::~ios_base(local_180);
        }
        else if (iVar5 == 10) {
          local_1f8 = (undefined1  [8])
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"...",3);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f0);
          std::ios_base::~ios_base(local_180);
        }
        iVar5 = iVar5 + 1;
      }
      uVar18 = uVar18 + 1;
    } while (uVar21 != uVar18);
  }
  (*local_298->unmapBuffer)(0x90d2);
  GVar10 = (*local_298->getError)();
  glu::checkError(GVar10,"glUnmapBuffer()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderSharedVarTests.cpp"
                  ,0x155);
  local_1f8 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
  std::ostream::_M_insert<unsigned_long>((ulong)&local_1f0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0," / ",3);
  std::ostream::_M_insert<unsigned_long>((ulong)&local_1f0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0," values passed",0xe);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f0);
  std::ios_base::~ios_base(local_180);
  description = "Pass";
  if (iVar5 != 0) {
    description = "Comparison failed";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)(iVar5 != 0),
             description);
  if ((undefined1 *)local_260._0_8_ != local_260 + 0x10) {
    operator_delete((void *)local_260._0_8_,CONCAT71(local_260._17_7_,local_260[0x10]) + 1);
  }
  if ((pointer)local_78._48_8_ != (pointer)0x0) {
    operator_delete((void *)local_78._48_8_,(long)local_38 - local_78._48_8_);
  }
  if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
    operator_delete((void *)local_78._0_8_,CONCAT71(local_78._17_7_,local_78[0x10]) + 1);
  }
  glu::ObjectWrapper::~ObjectWrapper(&local_210);
  return STOP;
}

Assistant:

SharedBasicVarCase::IterateResult SharedBasicVarCase::iterate (void)
{
	const glw::Functions&		gl				= m_context.getRenderContext().getFunctions();
	const deUint32				program			= m_program->getProgram();
	Buffer						outputBuffer	(m_context.getRenderContext());
	const deUint32				outBlockNdx		= gl.getProgramResourceIndex(program, GL_SHADER_STORAGE_BLOCK, "Result");
	const InterfaceBlockInfo	outBlockInfo	= getProgramInterfaceBlockInfo(gl, program, GL_SHADER_STORAGE_BLOCK, outBlockNdx);

	gl.useProgram(program);

	// Setup input values.
	{
		const int		numValues		= (int)product(m_workGroupSize);
		const int		valLoc			= gl.getUniformLocation(program, "u_val[0]");
		const int		refLoc			= gl.getUniformLocation(program, "u_ref[0]");
		const int		iterCountLoc	= gl.getUniformLocation(program, "u_numIters");
		const int		scalarSize		= getDataTypeScalarSize(m_basicType);

		if (isDataTypeFloatOrVec(m_basicType))
		{
			const int		maxInt			= m_precision == glu::PRECISION_LOWP ? 2 : 1024;
			const int		minInt			= -de::min(numValues/2, maxInt);
			vector<float>	values			(numValues*scalarSize);

			for (int ndx = 0; ndx < (int)values.size(); ndx++)
				values[ndx] = float(minInt + (ndx % (maxInt-minInt+1)));

			for (int uNdx = 0; uNdx < 2; uNdx++)
			{
				const int location = uNdx == 1 ? refLoc : valLoc;

				if (scalarSize == 1)		gl.uniform1fv(location, numValues, &values[0]);
				else if (scalarSize == 2)	gl.uniform2fv(location, numValues, &values[0]);
				else if (scalarSize == 3)	gl.uniform3fv(location, numValues, &values[0]);
				else if (scalarSize == 4)	gl.uniform4fv(location, numValues, &values[0]);
			}
		}
		else if (isDataTypeIntOrIVec(m_basicType))
		{
			const int		maxInt			= m_precision == glu::PRECISION_LOWP ? 64 : 1024;
			const int		minInt			= -de::min(numValues/2, maxInt);
			vector<int>		values			(numValues*scalarSize);

			for (int ndx = 0; ndx < (int)values.size(); ndx++)
				values[ndx] = minInt + (ndx % (maxInt-minInt+1));

			for (int uNdx = 0; uNdx < 2; uNdx++)
			{
				const int location = uNdx == 1 ? refLoc : valLoc;

				if (scalarSize == 1)		gl.uniform1iv(location, numValues, &values[0]);
				else if (scalarSize == 2)	gl.uniform2iv(location, numValues, &values[0]);
				else if (scalarSize == 3)	gl.uniform3iv(location, numValues, &values[0]);
				else if (scalarSize == 4)	gl.uniform4iv(location, numValues, &values[0]);
			}
		}
		else if (isDataTypeUintOrUVec(m_basicType))
		{
			const deUint32		maxInt		= m_precision == glu::PRECISION_LOWP ? 128 : 1024;
			vector<deUint32>	values		(numValues*scalarSize);

			for (int ndx = 0; ndx < (int)values.size(); ndx++)
				values[ndx] = ndx % (maxInt+1);

			for (int uNdx = 0; uNdx < 2; uNdx++)
			{
				const int location = uNdx == 1 ? refLoc : valLoc;

				if (scalarSize == 1)		gl.uniform1uiv(location, numValues, &values[0]);
				else if (scalarSize == 2)	gl.uniform2uiv(location, numValues, &values[0]);
				else if (scalarSize == 3)	gl.uniform3uiv(location, numValues, &values[0]);
				else if (scalarSize == 4)	gl.uniform4uiv(location, numValues, &values[0]);
			}
		}
		else if (isDataTypeBoolOrBVec(m_basicType))
		{
			de::Random		rnd				(0x324f);
			vector<int>		values			(numValues*scalarSize);

			for (int ndx = 0; ndx < (int)values.size(); ndx++)
				values[ndx] = rnd.getBool() ? 1 : 0;

			for (int uNdx = 0; uNdx < 2; uNdx++)
			{
				const int location = uNdx == 1 ? refLoc : valLoc;

				if (scalarSize == 1)		gl.uniform1iv(location, numValues, &values[0]);
				else if (scalarSize == 2)	gl.uniform2iv(location, numValues, &values[0]);
				else if (scalarSize == 3)	gl.uniform3iv(location, numValues, &values[0]);
				else if (scalarSize == 4)	gl.uniform4iv(location, numValues, &values[0]);
			}
		}
		else if (isDataTypeMatrix(m_basicType))
		{
			const int		maxInt			= m_precision == glu::PRECISION_LOWP ? 2 : 1024;
			const int		minInt			= -de::min(numValues/2, maxInt);
			vector<float>	values			(numValues*scalarSize);

			for (int ndx = 0; ndx < (int)values.size(); ndx++)
				values[ndx] = float(minInt + (ndx % (maxInt-minInt+1)));

			for (int uNdx = 0; uNdx < 2; uNdx++)
			{
				const int location = uNdx == 1 ? refLoc : valLoc;

				switch (m_basicType)
				{
					case TYPE_FLOAT_MAT2:	gl.uniformMatrix2fv  (location, numValues, DE_FALSE, &values[0]);	break;
					case TYPE_FLOAT_MAT2X3:	gl.uniformMatrix2x3fv(location, numValues, DE_FALSE, &values[0]);	break;
					case TYPE_FLOAT_MAT2X4:	gl.uniformMatrix2x4fv(location, numValues, DE_FALSE, &values[0]);	break;
					case TYPE_FLOAT_MAT3X2:	gl.uniformMatrix3x2fv(location, numValues, DE_FALSE, &values[0]);	break;
					case TYPE_FLOAT_MAT3:	gl.uniformMatrix3fv  (location, numValues, DE_FALSE, &values[0]);	break;
					case TYPE_FLOAT_MAT3X4:	gl.uniformMatrix3x4fv(location, numValues, DE_FALSE, &values[0]);	break;
					case TYPE_FLOAT_MAT4X2:	gl.uniformMatrix4x2fv(location, numValues, DE_FALSE, &values[0]);	break;
					case TYPE_FLOAT_MAT4X3:	gl.uniformMatrix4x3fv(location, numValues, DE_FALSE, &values[0]);	break;
					case TYPE_FLOAT_MAT4:	gl.uniformMatrix4fv  (location, numValues, DE_FALSE, &values[0]);	break;
					default:
						DE_ASSERT(false);
				}
			}
		}

		gl.uniform1ui(iterCountLoc, product(m_workGroupSize));
		GLU_EXPECT_NO_ERROR(gl.getError(), "Input value setup failed");
	}

	// Setup output buffer.
	{
		vector<deUint8> emptyData(outBlockInfo.dataSize);
		std::fill(emptyData.begin(), emptyData.end(), 0);

		gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, *outputBuffer);
		gl.bufferData(GL_SHADER_STORAGE_BUFFER, outBlockInfo.dataSize, &emptyData[0], GL_STATIC_READ);
		gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, *outputBuffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Output buffer setup failed");
	}

	gl.dispatchCompute(1, 1, 1);

	// Read back and compare
	{
		const deUint32				numValues	= product(m_workGroupSize);
		const InterfaceVariableInfo	outVarInfo	= getProgramInterfaceVariableInfo(gl, program, GL_BUFFER_VARIABLE, outBlockInfo.activeVariables[0]);
		const void*					resPtr		= gl.mapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, outBlockInfo.dataSize, GL_MAP_READ_BIT);
		const int					maxErrMsg	= 10;
		int							numFailed	= 0;

		GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBufferRange()");
		TCU_CHECK(resPtr);

		for (deUint32 ndx = 0; ndx < numValues; ndx++)
		{
			const int resVal = *((const int*)((const deUint8*)resPtr + outVarInfo.offset + outVarInfo.arrayStride*ndx));

			if (resVal == 0)
			{
				if (numFailed < maxErrMsg)
					m_testCtx.getLog() << TestLog::Message << "ERROR: isOk[" << ndx << "] = " << resVal << " != true" << TestLog::EndMessage;
				else if (numFailed == maxErrMsg)
					m_testCtx.getLog() << TestLog::Message << "..." << TestLog::EndMessage;

				numFailed += 1;
			}
		}

		gl.unmapBuffer(GL_SHADER_STORAGE_BUFFER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer()");

		m_testCtx.getLog() << TestLog::Message << (numValues-numFailed) << " / " << numValues << " values passed" << TestLog::EndMessage;

		m_testCtx.setTestResult(numFailed == 0 ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
								numFailed == 0 ? "Pass"					: "Comparison failed");
	}

	return STOP;
}